

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O1

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  PCF_Table pPVar1;
  PCF_Table pPVar2;
  FT_Byte FVar3;
  FT_Memory memory;
  undefined1 auVar4 [16];
  uint uVar5;
  FT_ULong FVar6;
  FT_ULong FVar7;
  ushort uVar8;
  short sVar9;
  FT_UInt32 FVar10;
  FT_Error FVar11;
  PCF_Table pPVar12;
  FT_ULong FVar13;
  FT_Memory P;
  PCF_Property pPVar14;
  FT_String *pFVar15;
  PCF_Metric pPVar16;
  FT_Bitmap_Size *pFVar17;
  FT_Memory pFVar18;
  FT_Byte *buffer;
  FT_Pointer pvVar19;
  FT_Long FVar20;
  PCF_Property pPVar21;
  char *pcVar22;
  short sVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  short sVar28;
  long lVar29;
  uint uVar30;
  FT_Frame_Field *fields;
  int iVar31;
  PCF_Metric metric;
  FT_Memory pFVar32;
  bool bVar33;
  bool bVar34;
  FT_Error error_2;
  FT_Error error;
  FT_Error error_1;
  FT_ULong format;
  FT_Error local_98;
  FT_Error local_94;
  FT_Memory local_90;
  undefined8 local_88;
  FT_Memory local_80;
  FT_Memory local_78;
  PCF_Property local_70;
  ulong local_68;
  ulong local_60;
  FT_Memory local_58;
  FT_ULong FStack_50;
  FT_ULong local_48;
  FT_ULong FStack_40;
  
  pFVar32 = (face->root).memory;
  local_88._0_4_ = FT_Stream_Seek(stream,0);
  local_94 = 1;
  if ((FT_Error)local_88 == 0) {
    local_88._0_4_ = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
    if (((((FT_Error)local_88 == 0) && (local_94 = 3, (face->toc).version == 0x70636601)) &&
        (uVar26 = (face->toc).count, uVar26 != 0)) && (uVar25 = stream->size, 0xf < uVar25)) {
      if (9 < uVar26 || uVar25 >> 4 < uVar26) {
        uVar26 = 9;
        if (uVar25 < 0x90) {
          uVar26 = uVar25 >> 4;
        }
        (face->toc).count = uVar26;
      }
      pPVar12 = (PCF_Table)
                ft_mem_qrealloc(pFVar32,0x20,0,(face->toc).count,(void *)0x0,(FT_Error *)&local_88);
      (face->toc).tables = pPVar12;
      local_94 = (FT_Error)local_88;
      if ((FT_Error)local_88 == 0) {
        local_90 = pFVar32;
        local_94 = (FT_Error)local_88;
        if ((face->toc).count != 0) {
          uVar26 = 1;
          iVar31 = (FT_Error)local_88;
          do {
            local_88._0_4_ = iVar31;
            local_88._0_4_ = FT_Stream_ReadFields(stream,pcf_table_header,pPVar12);
            if ((FT_Error)local_88 != 0) goto LAB_0022c0bc;
            pPVar12 = pPVar12 + 1;
            bVar34 = uVar26 < (face->toc).count;
            uVar26 = (ulong)((int)uVar26 + 1);
            iVar31 = 0;
            local_94 = 0x2fa0d0;
          } while (bVar34);
        }
        pFVar32 = local_90;
        if ((face->toc).count != 1) {
          pPVar12 = (face->toc).tables;
          uVar26 = 0;
          do {
            uVar30 = 1;
            bVar34 = false;
            do {
              uVar25 = (ulong)(uVar30 - 1);
              if ((face->toc).count + ~uVar26 <= uVar25) {
                iVar31 = (uint)!bVar34 << 3;
                break;
              }
              pPVar1 = pPVar12 + uVar25;
              pPVar2 = pPVar12 + uVar30;
              if (pPVar12[uVar30].offset < pPVar12[uVar25].offset) {
                local_58 = (FT_Memory)pPVar1->type;
                FStack_50 = pPVar1->format;
                local_48 = pPVar1->size;
                FStack_40 = pPVar1->offset;
                FVar13 = pPVar2->type;
                FVar6 = pPVar2->format;
                FVar7 = pPVar2->offset;
                pPVar1->size = pPVar2->size;
                pPVar1->offset = FVar7;
                pPVar1->type = FVar13;
                pPVar1->format = FVar6;
                pPVar2->size = local_48;
                pPVar2->offset = FStack_40;
                pPVar2->type = (FT_ULong)local_58;
                pPVar2->format = FStack_50;
                bVar34 = true;
              }
              if ((pPVar2->offset < pPVar1->size) ||
                 (pPVar2->offset - pPVar1->size < pPVar1->offset)) {
                local_88._0_4_ = 9;
                iVar31 = 7;
                bVar33 = false;
              }
              else {
                iVar31 = 0;
                bVar33 = true;
              }
              uVar30 = uVar30 + 1;
            } while (bVar33);
            if (iVar31 != 0) {
              if (iVar31 == 7) goto LAB_0022c0bc;
              if (iVar31 != 8) goto LAB_0022c0f4;
              break;
            }
            uVar26 = (ulong)((int)uVar26 + 1);
          } while (uVar26 < (face->toc).count - 1);
        }
        FVar13 = (face->toc).count;
        pPVar12 = (face->toc).tables;
        uVar26 = stream->size;
        if (FVar13 != 1) {
          uVar30 = 1;
          do {
            if ((uVar26 < pPVar12->size) || (uVar26 - pPVar12->size < pPVar12->offset))
            goto LAB_0022c0b4;
            pPVar12 = pPVar12 + 1;
            uVar25 = (ulong)uVar30;
            uVar30 = uVar30 + 1;
          } while (uVar25 < FVar13 - 1);
        }
        uVar25 = uVar26 - pPVar12->offset;
        if (uVar26 < pPVar12->offset) {
LAB_0022c0b4:
          local_88._0_4_ = 8;
LAB_0022c0bc:
          pFVar32 = local_90;
          ft_mem_free(local_90,(face->toc).tables);
          (face->toc).tables = (PCF_Table)0x0;
          local_94 = (FT_Error)local_88;
        }
        else {
          local_94 = 0;
          if (uVar25 < pPVar12->size) {
            pPVar12->size = uVar25;
          }
        }
      }
    }
  }
LAB_0022c0f4:
  if (local_94 != 0) goto LAB_0022c0fc;
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  memory = (face->root).memory;
  local_98 = pcf_seek_to_table_type
                       (stream,(face->toc).tables,(face->toc).count,1,(FT_ULong *)&local_58,
                        &local_88);
  if (local_98 == 0) {
    local_90 = pFVar32;
    FVar10 = FT_Stream_ReadULongLE(stream,&local_98);
    local_58 = (FT_Memory)(ulong)FVar10;
    if (FVar10 < 0x100 && local_98 == 0) {
      if ((FVar10 & 4) == 0) {
        uVar30 = FT_Stream_ReadULongLE(stream,&local_98);
      }
      else {
        uVar30 = FT_Stream_ReadULong(stream,&local_98);
      }
      uVar26 = (ulong)uVar30;
      if (local_98 != 0) goto LAB_0022c1ee;
      if (CONCAT44(local_88._4_4_,(FT_Error)local_88) / 9 < uVar26) {
        local_98 = 8;
        goto LAB_0022c1ee;
      }
      uVar25 = 0x100;
      if (uVar30 < 0x100) {
        uVar25 = uVar26;
      }
      face->nprops = (int)uVar25;
      local_70 = (PCF_Property)CONCAT44(local_88._4_4_,(FT_Error)local_88);
      local_68 = uVar26;
      P = (FT_Memory)ft_mem_qrealloc(memory,0x18,0,uVar25,(void *)0x0,&local_98);
      if (local_98 == 0) {
        local_60 = uVar25;
        if (local_68 != 0) {
          local_78 = (FT_Memory)(uVar25 * 0x18);
          buffer = (FT_Byte *)0x0;
          lVar29 = 0;
          FVar11 = local_98;
          local_80 = P;
          do {
            local_98 = FVar11;
            if ((FVar10 & 4) == 0) {
              fields = pcf_property_header;
            }
            else {
              fields = pcf_property_msb_header;
            }
            local_98 = FT_Stream_ReadFields(stream,fields,(void *)((long)local_80 + lVar29));
            P = local_80;
            pFVar32 = local_90;
            if (local_98 != 0) goto LAB_0022c1f7;
            lVar29 = lVar29 + 0x18;
            local_98 = 0;
            FVar11 = 0;
          } while (local_78 != (FT_Memory)lVar29);
        }
        uVar26 = local_68;
        local_98 = FT_Stream_Skip(stream,(local_68 - local_60) * 9);
        if (local_98 == 0) {
          FVar11 = 0;
          if (((uVar26 & 3) == 0) || (FVar11 = FT_Stream_Skip(stream,4 - (uVar26 & 3)), FVar11 == 0)
             ) {
            local_98 = FVar11;
            if ((FVar10 & 4) == 0) {
              uVar30 = FT_Stream_ReadULongLE(stream,&local_98);
            }
            else {
              uVar30 = FT_Stream_ReadULong(stream,&local_98);
            }
            pFVar32 = local_90;
            if (local_98 == 0) {
              pFVar18 = (FT_Memory)(ulong)uVar30;
              if (pFVar18 <= (FT_Memory)((long)local_70 + local_68 * -9)) {
                local_78 = (FT_Memory)0x1000100;
                if (pFVar18 < (FT_Memory)0x1000100) {
                  local_78 = pFVar18;
                }
                buffer = (FT_Byte *)
                         ft_mem_qalloc(memory,(FT_Long)((long)&local_78->user + 1),&local_98);
                if ((local_98 == 0) &&
                   (local_98 = FT_Stream_Read(stream,buffer,(FT_ULong)local_78), pFVar32 = local_90,
                   local_98 == 0)) {
                  buffer[(long)local_78] = '\0';
                  local_70 = (PCF_Property)
                             ft_mem_realloc(memory,0x18,0,local_60,(void *)0x0,&local_98);
                  pFVar32 = local_90;
                  if (local_98 == 0) {
                    face->properties = local_70;
                    if ((int)local_68 != 0) {
                      local_68 = local_60 * 0x18;
                      uVar26 = 0;
                      do {
                        if (local_78 < *(FT_Memory *)((long)P + uVar26)) {
                          local_98 = 9;
                          iVar31 = 2;
                        }
                        else {
                          pvVar19 = ft_mem_strdup(memory,(char *)(buffer + (long)&(*(FT_Memory *)
                                                                                    ((long)P +
                                                                                    uVar26))->user),
                                                  &local_98);
                          *(FT_Pointer *)((long)&local_70->name + uVar26) = pvVar19;
                          iVar31 = 2;
                          if (local_98 == 0) {
                            FVar3 = *(FT_Byte *)((long)P + uVar26 + 8);
                            (&local_70->isString)[uVar26] = FVar3;
                            pFVar32 = *(FT_Memory *)((long)P + uVar26 + 0x10);
                            if (FVar3 == '\0') {
                              *(FT_Memory *)((long)&local_70->value + uVar26) = pFVar32;
                            }
                            else {
                              if (local_78 < pFVar32) {
                                local_98 = 9;
                                iVar31 = 2;
                                bVar34 = false;
                              }
                              else {
                                pvVar19 = ft_mem_strdup(memory,(char *)(buffer + (long)&pFVar32->
                                                  user),&local_98);
                                *(FT_Pointer *)((long)&local_70->value + uVar26) = pvVar19;
                                bVar34 = local_98 == 0;
                                iVar31 = (uint)!bVar34 * 2;
                              }
                              if (!bVar34) goto LAB_0022ca3c;
                            }
                            iVar31 = 0;
                          }
                        }
LAB_0022ca3c:
                        if (iVar31 != 0) {
                          pFVar32 = local_90;
                          if (iVar31 == 2) goto LAB_0022c1f7;
                          goto LAB_0022c20d;
                        }
                        uVar26 = uVar26 + 0x18;
                      } while (local_68 != uVar26);
                    }
                    local_98 = 0;
                    pFVar32 = local_90;
                  }
                }
                goto LAB_0022c1f7;
              }
              local_98 = 8;
            }
            buffer = (FT_Byte *)0x0;
            goto LAB_0022c1f7;
          }
        }
        local_98 = 0x53;
        buffer = (FT_Byte *)0x0;
        pFVar32 = local_90;
        goto LAB_0022c1f7;
      }
    }
    else {
LAB_0022c1ee:
      P = (FT_Memory)0x0;
    }
    buffer = (FT_Byte *)0x0;
    pFVar32 = local_90;
  }
  else {
    buffer = (FT_Byte *)0x0;
    P = (FT_Memory)(void *)0x0;
  }
LAB_0022c1f7:
  ft_mem_free(memory,P);
  ft_mem_free(memory,buffer);
  iVar31 = local_98;
LAB_0022c20d:
  local_94 = iVar31;
  if (iVar31 == 0) {
    FVar13 = (face->toc).count;
    if (FVar13 == 0) {
      bVar34 = true;
    }
    else {
      pPVar12 = (face->toc).tables;
      do {
        FVar13 = FVar13 - 1;
        bVar33 = pPVar12->type == 0x100;
        bVar34 = !bVar33;
        if (bVar33) break;
        pPVar12 = pPVar12 + 1;
      } while (FVar13 != 0);
    }
    local_94 = 0;
    if ((!bVar34) || (local_94 = iVar31, local_94 = pcf_get_accel(stream,face,2), local_94 == 0)) {
      local_80 = (face->root).memory;
      local_90 = pFVar32;
      local_98 = pcf_seek_to_table_type
                           (stream,(face->toc).tables,(face->toc).count,4,(FT_ULong *)&local_58,
                            &local_88);
      FVar11 = local_98;
      if (local_98 == 0) {
        FVar10 = FT_Stream_ReadULongLE(stream,&local_98);
        local_58 = (FT_Memory)(ulong)FVar10;
        FVar11 = local_98;
        if ((local_98 == 0) && (FVar11 = 3, (FVar10 & 0xfffffe00) == 0)) {
          local_78 = local_58;
          if ((FVar10 & 0xffffff00) == 0) {
            if ((FVar10 & 4) == 0) {
              uVar30 = FT_Stream_ReadULongLE(stream,&local_98);
            }
            else {
              uVar30 = FT_Stream_ReadULong(stream,&local_98);
            }
            uVar26 = (ulong)uVar30;
          }
          else {
            if ((FVar10 & 4) == 0) {
              uVar8 = FT_Stream_ReadUShortLE(stream,&local_98);
            }
            else {
              uVar8 = FT_Stream_ReadUShort(stream,&local_98);
            }
            uVar26 = (ulong)uVar8;
          }
          if (local_98 == 0) {
            if ((FVar10 & 0xffffff00) == 0) {
              uVar25 = CONCAT44(local_88._4_4_,(FT_Error)local_88) / 0xc;
            }
            else {
              uVar25 = CONCAT44(local_88._4_4_,(FT_Error)local_88) / 5;
            }
            FVar11 = 8;
            if (uVar26 - 1 < uVar25) {
              FVar13 = uVar26 + 1;
              if (0xfffe < uVar26) {
                FVar13 = 0xffff;
              }
              face->nmetrics = FVar13;
              pPVar16 = (PCF_Metric)ft_mem_qrealloc(local_80,0x18,0,FVar13,(void *)0x0,&local_98);
              face->metrics = pPVar16;
              FVar11 = local_98;
              if (local_98 == 0) {
                if (1 < face->nmetrics) {
                  uVar26 = 1;
                  do {
                    local_98 = FVar11;
                    metric = pPVar16 + 1;
                    local_98 = pcf_get_metric(stream,(FT_ULong)local_78,metric);
                    pPVar16[1].bits = 0;
                    if (local_98 != 0) break;
                    if ((pPVar16[1].rightSideBearing < metric->leftSideBearing) ||
                       (SBORROW4((int)pPVar16[1].ascent,-(int)pPVar16[1].descent) !=
                        (int)pPVar16[1].ascent + (int)pPVar16[1].descent < 0)) {
                      pPVar16[1].descent = 0;
                      metric->leftSideBearing = 0;
                      metric->rightSideBearing = 0;
                      metric->characterWidth = 0;
                      metric->ascent = 0;
                    }
                    uVar26 = uVar26 + 1;
                    pPVar16 = metric;
                    FVar11 = 0;
                  } while (uVar26 < face->nmetrics);
                }
                FVar11 = local_98;
                if (local_98 != 0) {
                  ft_mem_free(local_80,face->metrics);
                  face->metrics = (PCF_Metric)0x0;
                  FVar11 = local_98;
                }
              }
            }
          }
        }
      }
      pFVar32 = local_90;
      local_94 = FVar11;
      if (FVar11 == 0) {
        local_98 = pcf_seek_to_table_type
                             (stream,(face->toc).tables,(face->toc).count,8,(FT_ULong *)&local_58,
                              &local_88);
        FVar11 = local_98;
        if ((local_98 == 0) &&
           (local_98 = FT_Stream_EnterFrame(stream,8), FVar11 = local_98, local_98 == 0)) {
          FVar10 = FT_Stream_GetULongLE(stream);
          local_80 = (FT_Memory)(ulong)FVar10;
          local_58 = local_80;
          if ((FVar10 & 4) == 0) {
            uVar30 = FT_Stream_GetULongLE(stream);
          }
          else {
            uVar30 = FT_Stream_GetULong(stream);
          }
          FT_Stream_ExitFrame(stream);
          FVar11 = 3;
          if ((uint)local_80 < 0x100) {
            uVar5 = 0xfffe;
            if (uVar30 < 0xfffe) {
              uVar5 = uVar30;
            }
            uVar26 = (ulong)uVar5;
            if (face->nmetrics - 1 == uVar26) {
              if (uVar30 != 0) {
                local_78 = (FT_Memory)(stream->pos + uVar26 * 4 + 0x10);
                uVar25 = CONCAT44(local_88._4_4_,(FT_Error)local_88);
                lVar29 = 0;
                do {
                  if (((ulong)local_80 & 4) == 0) {
                    uVar30 = FT_Stream_ReadULongLE(stream,&local_98);
                  }
                  else {
                    uVar30 = FT_Stream_ReadULong(stream,&local_98);
                  }
                  uVar27 = 0;
                  if (uVar30 <= uVar25) {
                    uVar27 = (ulong)uVar30;
                  }
                  *(ulong *)((long)&face->metrics[1].bits + lVar29) = (long)&local_78->user + uVar27
                  ;
                  lVar29 = lVar29 + 0x18;
                } while (uVar26 * 0x18 != lVar29);
              }
              pFVar32 = local_90;
              FVar11 = local_98;
              if (local_98 == 0) {
                lVar29 = 4;
                do {
                  if (((ulong)local_80 & 4) == 0) {
                    FT_Stream_ReadULongLE(stream,&local_98);
                  }
                  else {
                    FT_Stream_ReadULong(stream,&local_98);
                  }
                  pFVar32 = local_90;
                  FVar11 = local_98;
                  if (local_98 != 0) goto LAB_0022c598;
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
                face->bitmapsFormat = (FT_ULong)local_80;
              }
            }
          }
        }
LAB_0022c598:
        local_94 = FVar11;
        if (((FVar11 == 0) && (local_94 = pcf_get_encodings(stream,face), local_94 == 0)) &&
           ((FVar11 = 0, bVar34 ||
            (local_94 = pcf_get_accel(stream,face,0x100), FVar11 = local_94, local_94 == 0)))) {
          local_94 = FVar11;
          uVar26 = (face->root).face_flags;
          (face->root).face_flags = uVar26 | 0x12;
          if ((face->accel).constantWidth != '\0') {
            (face->root).face_flags = uVar26 | 0x16;
          }
          local_94 = pcf_interpret_style(face);
          if (local_94 == 0) {
            pPVar14 = pcf_find_property(face,"FAMILY_NAME");
            if ((pPVar14 == (PCF_Property)0x0) || (pPVar14->isString == '\0')) {
              (face->root).family_name = (FT_String *)0x0;
            }
            else {
              pFVar15 = (FT_String *)ft_mem_strdup(pFVar32,(pPVar14->value).atom,&local_94);
              (face->root).family_name = pFVar15;
              if (local_94 != 0) goto LAB_0022c0fc;
            }
            (face->root).num_glyphs = face->nmetrics;
            (face->root).num_fixed_sizes = 1;
            pFVar17 = (FT_Bitmap_Size *)ft_mem_alloc(pFVar32,0x20,&local_94);
            (face->root).available_sizes = pFVar17;
            if (local_94 == 0) {
              uVar25 = (face->accel).fontDescent + (face->accel).fontAscent;
              uVar26 = -uVar25;
              if (0 < (long)uVar25) {
                uVar26 = uVar25;
              }
              sVar23 = 0x7fff;
              if (uVar26 < 0x8000) {
                sVar28 = (short)uVar25;
                sVar23 = -sVar28;
                if (0 < sVar28) {
                  sVar23 = sVar28;
                }
              }
              pFVar17->height = sVar23;
              pPVar14 = pcf_find_property(face,"AVERAGE_WIDTH");
              if (pPVar14 == (PCF_Property)0x0) {
                sVar23 = (short)((sVar23 * 2 + 1) / 3);
              }
              else {
                FVar13 = (pPVar14->value).ul;
                uVar26 = -FVar13;
                if (0 < (long)FVar13) {
                  uVar26 = FVar13;
                }
                sVar23 = 0x7fff;
                if (uVar26 < 0x4fff2) {
                  auVar4 = SEXT816((long)(FVar13 + 5)) * SEXT816(0x6666666666666667);
                  sVar28 = (short)(auVar4._8_4_ >> 2) - (auVar4._14_2_ >> 0xf);
                  sVar23 = -sVar28;
                  if (0 < sVar28) {
                    sVar23 = sVar28;
                  }
                }
              }
              pFVar17->width = sVar23;
              pPVar14 = pcf_find_property(face,"POINT_SIZE");
              if (pPVar14 != (PCF_Property)0x0) {
                uVar26 = (pPVar14->value).l;
                uVar25 = -uVar26;
                if (0 < (long)uVar26) {
                  uVar25 = uVar26;
                }
                FVar20 = 0x7fff;
                if (uVar25 < 0x504c3) {
                  FVar20 = FT_MulDiv(uVar25,0x70800,0x11a4e);
                }
                pFVar17->size = FVar20;
              }
              pPVar14 = pcf_find_property(face,"PIXEL_SIZE");
              if (pPVar14 != (PCF_Property)0x0) {
                FVar13 = (pPVar14->value).ul;
                uVar26 = -FVar13;
                if (0 < (long)FVar13) {
                  uVar26 = FVar13;
                }
                uVar25 = 0x1fffc0;
                if (uVar26 < 0x8000) {
                  iVar24 = (int)(short)FVar13;
                  iVar31 = -iVar24;
                  if (0 < iVar24) {
                    iVar31 = iVar24;
                  }
                  uVar25 = (ulong)(uint)(iVar31 << 6);
                }
                pFVar17->y_ppem = uVar25;
              }
              pPVar14 = pcf_find_property(face,"RESOLUTION_X");
              if (pPVar14 == (PCF_Property)0x0) {
                sVar23 = 0;
              }
              else {
                uVar26 = (pPVar14->value).l;
                uVar25 = -uVar26;
                if (0 < (long)uVar26) {
                  uVar25 = uVar26;
                }
                sVar23 = 0x7fff;
                if (uVar25 < 0x8000) {
                  sVar28 = (short)uVar26;
                  sVar23 = -sVar28;
                  if (0 < sVar28) {
                    sVar23 = sVar28;
                  }
                }
              }
              pPVar14 = pcf_find_property(face,"RESOLUTION_Y");
              if (pPVar14 == (PCF_Property)0x0) {
                sVar28 = 0;
              }
              else {
                uVar26 = (pPVar14->value).l;
                uVar25 = -uVar26;
                if (0 < (long)uVar26) {
                  uVar25 = uVar26;
                }
                sVar28 = 0x7fff;
                if (uVar25 < 0x8000) {
                  sVar9 = (short)uVar26;
                  sVar28 = -sVar9;
                  if (0 < sVar9) {
                    sVar28 = sVar9;
                  }
                }
              }
              if (pFVar17->y_ppem == 0) {
                pFVar17->y_ppem = pFVar17->size;
                if (sVar28 != 0) {
                  FVar20 = FT_MulDiv(pFVar17->size,(long)sVar28,0x48);
                  pFVar17->y_ppem = FVar20;
                }
              }
              FVar20 = pFVar17->y_ppem;
              if ((sVar23 != 0) && (sVar28 != 0)) {
                FVar20 = FT_MulDiv(FVar20,(long)sVar23,(long)sVar28);
              }
              pFVar17->x_ppem = FVar20;
              pPVar14 = pcf_find_property(face,"CHARSET_REGISTRY");
              pPVar21 = pcf_find_property(face,"CHARSET_ENCODING");
              pFVar32 = local_90;
              if (((pPVar14 != (PCF_Property)0x0) &&
                  (pPVar21 != (PCF_Property)0x0 && pPVar14->isString != '\0')) &&
                 (pPVar21->isString != '\0')) {
                pcVar22 = (char *)ft_mem_strdup(local_90,(pPVar21->value).atom,&local_94);
                face->charset_encoding = pcVar22;
                if (local_94 == 0) {
                  pcVar22 = (char *)ft_mem_strdup(pFVar32,(pPVar14->value).atom,&local_94);
                  face->charset_registry = pcVar22;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0022c0fc:
  if (local_94 != 0) {
    local_94 = 3;
  }
  return local_94;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      root->num_glyphs = (FT_Long)face->nmetrics;

      root->num_fixed_sizes = 1;
      if ( FT_NEW( root->available_sizes ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = ( bsize->height * 2 + 1 ) / 3;
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %ld\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %ld\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }